

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_timer.c
# Opt level: O2

void test_eventloop_error(void)

{
  cio_error cVar1;
  int *piVar2;
  cio_timer timer;
  
  timerfd_create_fake.return_val = 5;
  read_fake.custom_fake = read_blocks;
  handle_timeout_fake.custom_fake = close_in_timeout;
  getsockopt_fake.return_val = -1;
  cVar1 = cio_timer_init(&timer,(cio_eventloop *)0x0,(cio_timer_close_hook_t)0x0);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0xf8,UNITY_DISPLAY_STYLE_INT);
  cio_timer_expires_from_now(&timer,2000,handle_timeout,(void *)0x0);
  piVar2 = __errno_location();
  *piVar2 = 0x69;
  (*timer.impl.ev.read_callback)(&timer,CIO_EPOLL_ERROR);
  UnityAssertEqualNumber(1,(ulong)close_fake.call_count,(char *)0x0,0xff,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(5,(long)close_fake.arg0_val,(char *)0x0,0x100,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)handle_timeout_fake.call_count,(char *)0x0,0x102,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (-0x69,(long)handle_timeout_fake.arg2_val,(char *)0x0,0x103,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)&timer,(UNITY_INT)handle_timeout_fake.arg0_val,(char *)0x0,0x104,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_eventloop_error(void)
{
	static const int timerfd = 5;
	timerfd_create_fake.return_val = timerfd;
	read_fake.custom_fake = read_blocks;
	handle_timeout_fake.custom_fake = close_in_timeout;
	getsockopt_fake.return_val = -1;

	struct cio_timer timer;
	enum cio_error err = cio_timer_init(&timer, NULL, NULL);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);

	cio_timer_expires_from_now(&timer, 2000, handle_timeout, NULL);
	errno = ENOBUFS;

	timer.impl.ev.read_callback(&timer, CIO_EPOLL_ERROR);

	TEST_ASSERT_EQUAL(1, close_fake.call_count);
	TEST_ASSERT_EQUAL(timerfd, close_fake.arg0_val);

	TEST_ASSERT_EQUAL(1, handle_timeout_fake.call_count);
	TEST_ASSERT_EQUAL(CIO_NO_BUFFER_SPACE, handle_timeout_fake.arg2_val);
	TEST_ASSERT_EQUAL(&timer, handle_timeout_fake.arg0_val);
}